

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# repeated_field.h
# Opt level: O3

const_reference __thiscall
google::protobuf::RepeatedField<int>::Get(RepeatedField<int> *this,int index)

{
  uint uVar1;
  uint extraout_EAX;
  int *piVar2;
  DescriptorBuilder *this_00;
  DeferredValidation *in_RCX;
  Tables *tables;
  DescriptorPool *pool;
  const_reference piVar3;
  ErrorCollector *in_R8;
  
  piVar3 = (const_reference)(ulong)(uint)index;
  if (index < 0) {
    Get();
    uVar1 = extraout_EAX;
  }
  else {
    uVar1 = internal::SooRep::size
                      (&this->soo_rep_,
                       (undefined1  [16])
                       ((undefined1  [16])(this->soo_rep_).field_0 & (undefined1  [16])0x4) ==
                       (undefined1  [16])0x0);
    if (index < (int)uVar1) {
      piVar2 = elements(this,(undefined1  [16])
                             ((undefined1  [16])(this->soo_rep_).field_0 & (undefined1  [16])0x4) ==
                             (undefined1  [16])0x0);
      return piVar2 + (long)piVar3;
    }
  }
  pool = (DescriptorPool *)(ulong)uVar1;
  Get();
  this_00 = (DescriptorBuilder *)operator_new(0x170);
  DescriptorBuilder::DescriptorBuilder(this_00,pool,tables,in_RCX,in_R8);
  *(DescriptorBuilder **)piVar3 = this_00;
  return piVar3;
}

Assistant:

inline const Element& RepeatedField<Element>::Get(int index) const
    ABSL_ATTRIBUTE_LIFETIME_BOUND {
  ABSL_DCHECK_GE(index, 0);
  ABSL_DCHECK_LT(index, size());
  return elements(is_soo())[index];
}